

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

char * find_build_path(void)

{
  int iVar1;
  char *__dest;
  char *left;
  char *right;
  char *path;
  char *local_18;
  char *local_10;
  
  __dest = (char *)malloc(0x6f);
  strcpy(__dest,
         "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]ipc-bench/source/common/process.c"
        );
  local_18 = __dest + 0x59;
  local_10 = __dest + 0x61;
  while ((__dest <= local_18 &&
         (((*local_18 != 'i' || (*local_10 != 'h')) ||
          (iVar1 = strncmp("ipc-bench",local_18,9), iVar1 != 0))))) {
    local_18 = local_18 + -1;
    local_10 = local_10 + -1;
  }
  strcpy(local_10 + 1,"/build/source");
  return __dest;
}

Assistant:

char *find_build_path() {
	char *path = (char *)malloc(strlen(__FILE__) + strlen(BUILD_PATH));
	char *right;
	char *left;

	strcpy(path, __FILE__);
	right = path + strlen(__FILE__);
	left = right - strlen("ipc-bench");

	// Make the string-comparison expected O(N)
	// by only doing a string-comparison when
	// the first and last character match
	for (--right; left >= path; --left, --right) {
		if (*left == 'i' && *right == 'h') {
			if (strncmp("ipc-bench", left, 9) == 0) {
				break;
			}
		}
	}

	// ++ because right is on the 'h'
	strcpy(++right, BUILD_PATH);

	return path;
}